

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# armci.c
# Opt level: O0

int PARMCI_NbGetV(armci_giov_t *darr,int len,int proc,armci_hdl_t *nb_handle)

{
  int iVar1;
  comex_giov_t *b;
  undefined8 in_RCX;
  undefined4 in_EDX;
  int in_ESI;
  armci_giov_t *in_RDI;
  comex_giov_t *adarr;
  int rc;
  comex_group_t in_stack_ffffffffffffffe4;
  
  b = (comex_giov_t *)malloc((long)in_ESI * 0x18);
  convert_giov(in_RDI,b,in_ESI);
  iVar1 = comex_nbgetv((comex_giov_t *)CONCAT44(in_ESI,in_EDX),(int)((ulong)in_RCX >> 0x20),
                       (int)in_RCX,in_stack_ffffffffffffffe4,(comex_request_t *)b);
  free(b);
  return iVar1;
}

Assistant:

int PARMCI_NbGetV(armci_giov_t *darr, int len, int proc, armci_hdl_t *nb_handle)
{
    int rc;
    comex_giov_t *adarr = malloc(sizeof(comex_giov_t) * len);
    convert_giov(darr, adarr, len);
    rc = comex_nbgetv(adarr, len, proc, COMEX_GROUP_WORLD, nb_handle);
    free(adarr);
    return rc;
}